

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

uint16_t __thiscall icu_63::ForwardUTrie2StringIterator::next16(ForwardUTrie2StringIterator *this)

{
  ushort uVar1;
  ushort *puVar2;
  int local_34;
  uint16_t local_1a;
  uint16_t __c2;
  uint16_t result;
  ForwardUTrie2StringIterator *this_local;
  
  *(undefined8 *)(this + 8) = *(undefined8 *)(this + 0x10);
  if (*(long *)(this + 0x10) == *(long *)(this + 0x20)) {
    *(undefined4 *)(this + 0x18) = 0xffffffff;
    this_local._6_2_ = (uint16_t)*(undefined4 *)(*(long *)this + 0x28);
  }
  else {
    puVar2 = *(ushort **)(this + 0x10);
    *(ushort **)(this + 0x10) = puVar2 + 1;
    *(uint *)(this + 0x18) = (uint)*puVar2;
    if ((*(uint *)(this + 0x18) & 0xfffffc00) == 0xd800) {
      if ((*(long *)(this + 0x10) == *(long *)(this + 0x20)) ||
         (uVar1 = **(ushort **)(this + 0x10), (uVar1 & 0xfc00) != 0xdc00)) {
        local_1a = *(uint16_t *)
                    (**(long **)this +
                    (long)(int)((uint)*(ushort *)
                                       (**(long **)this +
                                       (long)((*(int *)(this + 0x18) >> 5) + 0x140) * 2) * 4 +
                               (*(uint *)(this + 0x18) & 0x1f)) * 2);
      }
      else {
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 2;
        *(uint *)(this + 0x18) = *(int *)(this + 0x18) * 0x400 + (uint)uVar1 + -0x35fdc00;
        if (*(int *)(this + 0x18) < *(int *)(*(long *)this + 0x2c)) {
          local_34 = (uint)*(ushort *)
                            (**(long **)this +
                            (long)(int)((uint)*(ushort *)
                                               (**(long **)this +
                                               (long)((*(int *)(this + 0x18) >> 0xb) + 0x820) * 2) +
                                       (*(int *)(this + 0x18) >> 5 & 0x3fU)) * 2) * 4 +
                     (*(uint *)(this + 0x18) & 0x1f);
        }
        else {
          local_34 = *(int *)(*(long *)this + 0x30);
        }
        local_1a = *(uint16_t *)(**(long **)this + (long)local_34 * 2);
      }
    }
    else {
      local_1a = *(uint16_t *)
                  (**(long **)this +
                  (long)(int)((uint)*(ushort *)
                                     (**(long **)this + (long)(*(int *)(this + 0x18) >> 5) * 2) * 4
                             + (*(uint *)(this + 0x18) & 0x1f)) * 2);
    }
    this_local._6_2_ = local_1a;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t ForwardUTrie2StringIterator::next16() {
    codePointStart=codePointLimit;
    if(codePointLimit==limit) {
        codePoint=U_SENTINEL;
        return static_cast<uint16_t>(trie->errorValue);
    }
    uint16_t result;
    UTRIE2_U16_NEXT16(trie, codePointLimit, limit, codePoint, result);
    return result;
}